

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata.cc
# Opt level: O1

void __thiscall ProfileData::Reset(ProfileData *this)

{
  if (-1 < this->out_) {
    close(this->out_);
    if (this->hash_ != (Bucket *)0x0) {
      operator_delete__(this->hash_);
    }
    this->hash_ = (Bucket *)0x0;
    if (this->evict_ != (Slot *)0x0) {
      operator_delete__(this->evict_);
    }
    this->evict_ = (Slot *)0x0;
    this->num_evicted_ = 0;
    free(this->fname_);
    this->fname_ = (char *)0x0;
    this->start_time_ = 0;
    this->out_ = -1;
  }
  return;
}

Assistant:

void ProfileData::Reset() {
  if (!enabled()) {
    return;
  }

  // Don't reset count_, evictions_, or total_bytes_ here.  They're used
  // by Stop to print information about the profile after reset, and are
  // cleared by Start when starting a new profile.
  close(out_);
  delete[] hash_;
  hash_ = 0;
  delete[] evict_;
  evict_ = 0;
  num_evicted_ = 0;
  free(fname_);
  fname_ = 0;
  start_time_ = 0;

  out_ = -1;
}